

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-while-connecting.c
# Opt level: O3

int run_test_tcp_close_while_connecting(void)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  sockaddr_in addr;
  uv_connect_t connect_req;
  undefined1 local_80 [16];
  undefined1 local_70 [96];
  
  uVar2 = uv_default_loop();
  iVar3 = 0x23a3;
  iVar1 = uv_ip4_addr("1.2.3.4",0x23a3,local_80);
  if (iVar1 == 0) {
    iVar3 = 0x31d190;
    iVar1 = uv_tcp_init(uVar2);
    if (iVar1 != 0) goto LAB_0017154b;
    iVar3 = 0x31d190;
    iVar1 = uv_tcp_connect(local_70,&tcp_handle,local_80,connect_cb);
    if (iVar1 != 0) {
      if (iVar1 == -0x65) {
LAB_0017153a:
        run_test_tcp_close_while_connecting_cold_12();
        return 1;
      }
      goto LAB_00171550;
    }
    iVar3 = 0x31d288;
    iVar1 = uv_timer_init(uVar2);
    if (iVar1 != 0) goto LAB_00171555;
    iVar3 = 0x1715b3;
    iVar1 = uv_timer_start(&timer1_handle,timer1_cb,1,0);
    if (iVar1 != 0) goto LAB_0017155a;
    iVar3 = 0x31d320;
    iVar1 = uv_timer_init(uVar2);
    if (iVar1 != 0) goto LAB_0017155f;
    iVar3 = 0x1715da;
    iVar1 = uv_timer_start(&timer2_handle,timer2_cb,86400000,0);
    if (iVar1 != 0) goto LAB_00171564;
    iVar3 = 0;
    iVar1 = uv_run(uVar2);
    if (iVar1 != 0) goto LAB_00171569;
    if (connect_cb_called != 1) goto LAB_0017156e;
    if (timer1_cb_called != 1) goto LAB_00171573;
    if (close_cb_called == 2) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      iVar3 = 0;
      uv_run(uVar2);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        if (netunreach_errors < 1) {
          return 0;
        }
        goto LAB_0017153a;
      }
      goto LAB_0017157d;
    }
  }
  else {
    run_test_tcp_close_while_connecting_cold_1();
LAB_0017154b:
    run_test_tcp_close_while_connecting_cold_2();
LAB_00171550:
    run_test_tcp_close_while_connecting_cold_13();
LAB_00171555:
    run_test_tcp_close_while_connecting_cold_3();
LAB_0017155a:
    run_test_tcp_close_while_connecting_cold_4();
LAB_0017155f:
    run_test_tcp_close_while_connecting_cold_5();
LAB_00171564:
    run_test_tcp_close_while_connecting_cold_6();
LAB_00171569:
    run_test_tcp_close_while_connecting_cold_7();
LAB_0017156e:
    run_test_tcp_close_while_connecting_cold_8();
LAB_00171573:
    run_test_tcp_close_while_connecting_cold_9();
  }
  run_test_tcp_close_while_connecting_cold_10();
LAB_0017157d:
  run_test_tcp_close_while_connecting_cold_11();
  if ((iVar3 != -0x7d) && (iVar3 != -0x65)) {
    connect_cb_cold_1();
    uv_close();
    iVar1 = uv_close(&tcp_handle,close_cb);
    timer1_cb_called = timer1_cb_called + 1;
    return iVar1;
  }
  iVar1 = uv_timer_stop(&timer2_handle);
  connect_cb_called = connect_cb_called + 1;
  if (iVar3 == -0x65) {
    netunreach_errors = netunreach_errors + 1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_close_while_connecting) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("1.2.3.4", TEST_PORT, &addr));
  ASSERT(0 == uv_tcp_init(loop, &tcp_handle));
  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT(r == 0);
  ASSERT(0 == uv_timer_init(loop, &timer1_handle));
  ASSERT(0 == uv_timer_start(&timer1_handle, timer1_cb, 1, 0));
  ASSERT(0 == uv_timer_init(loop, &timer2_handle));
  ASSERT(0 == uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(connect_cb_called == 1);
  ASSERT(timer1_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();

  if (netunreach_errors > 0)
    RETURN_SKIP("Network unreachable.");

  return 0;
}